

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind6-error.c
# Opt level: O3

int run_test_tcp_bind6_error_addrinuse(void)

{
  short sVar1;
  int iVar2;
  undefined8 uVar3;
  short *psVar4;
  ulong uVar5;
  uint uVar6;
  undefined8 unaff_RBX;
  bool bVar7;
  sockaddr_in6 addr;
  uv_tcp_t server2;
  uv_tcp_t server1;
  int iStack_23c;
  long lStack_238;
  code *pcStack_230;
  undefined1 local_21c [28];
  undefined1 local_200 [248];
  undefined1 local_108 [248];
  
  pcStack_230 = (code *)0x1708e7;
  iVar2 = can_ipv6();
  if (iVar2 == 0) {
    pcStack_230 = (code *)0x170a33;
    run_test_tcp_bind6_error_addrinuse_cold_10();
    return 1;
  }
  pcStack_230 = (code *)0x170905;
  iVar2 = uv_ip6_addr("::",0x23a3,local_21c);
  if (iVar2 == 0) {
    pcStack_230 = (code *)0x170912;
    uVar3 = uv_default_loop();
    pcStack_230 = (code *)0x170922;
    iVar2 = uv_tcp_init(uVar3,local_108);
    if (iVar2 != 0) goto LAB_00170a3f;
    pcStack_230 = (code *)0x17093e;
    iVar2 = uv_tcp_bind(local_108,local_21c,0);
    if (iVar2 != 0) goto LAB_00170a44;
    pcStack_230 = (code *)0x17094b;
    uVar3 = uv_default_loop();
    pcStack_230 = (code *)0x170958;
    iVar2 = uv_tcp_init(uVar3,local_200);
    if (iVar2 != 0) goto LAB_00170a49;
    pcStack_230 = (code *)0x170971;
    iVar2 = uv_tcp_bind(local_200,local_21c,0);
    if (iVar2 != 0) goto LAB_00170a4e;
    pcStack_230 = (code *)0x17098d;
    iVar2 = uv_listen(local_108,0x80,0);
    if (iVar2 != 0) goto LAB_00170a53;
    pcStack_230 = (code *)0x1709a6;
    iVar2 = uv_listen(local_200,0x80,0);
    if (iVar2 != -0x62) goto LAB_00170a58;
    pcStack_230 = (code *)0x1709c6;
    uv_close(local_108,close_cb);
    pcStack_230 = (code *)0x1709d3;
    uv_close(local_200,close_cb);
    pcStack_230 = (code *)0x1709d8;
    uVar3 = uv_default_loop();
    unaff_RBX = 0;
    pcStack_230 = (code *)0x1709e4;
    uv_run(uVar3,0);
    if (close_cb_called == 2) {
      pcStack_230 = (code *)0x1709f2;
      uVar3 = uv_default_loop();
      pcStack_230 = (code *)0x170a06;
      uv_walk(uVar3,close_walk_cb,0);
      pcStack_230 = (code *)0x170a10;
      uv_run(uVar3,0);
      pcStack_230 = (code *)0x170a15;
      uVar3 = uv_default_loop();
      pcStack_230 = (code *)0x170a1d;
      iVar2 = uv_loop_close(uVar3);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_00170a62;
    }
  }
  else {
    pcStack_230 = (code *)0x170a3f;
    run_test_tcp_bind6_error_addrinuse_cold_1();
LAB_00170a3f:
    pcStack_230 = (code *)0x170a44;
    run_test_tcp_bind6_error_addrinuse_cold_2();
LAB_00170a44:
    pcStack_230 = (code *)0x170a49;
    run_test_tcp_bind6_error_addrinuse_cold_3();
LAB_00170a49:
    pcStack_230 = (code *)0x170a4e;
    run_test_tcp_bind6_error_addrinuse_cold_4();
LAB_00170a4e:
    pcStack_230 = (code *)0x170a53;
    run_test_tcp_bind6_error_addrinuse_cold_5();
LAB_00170a53:
    pcStack_230 = (code *)0x170a58;
    run_test_tcp_bind6_error_addrinuse_cold_6();
LAB_00170a58:
    pcStack_230 = (code *)0x170a5d;
    run_test_tcp_bind6_error_addrinuse_cold_7();
  }
  pcStack_230 = (code *)0x170a62;
  run_test_tcp_bind6_error_addrinuse_cold_8();
LAB_00170a62:
  pcStack_230 = can_ipv6;
  run_test_tcp_bind6_error_addrinuse_cold_9();
  pcStack_230 = (code *)unaff_RBX;
  iVar2 = uv_interface_addresses(&lStack_238,&iStack_23c);
  uVar6 = 0;
  if (iVar2 == 0) {
    if ((long)iStack_23c < 1) {
      uVar6 = 0;
    }
    else {
      psVar4 = (short *)(lStack_238 + 0x14);
      uVar5 = 1;
      do {
        sVar1 = *psVar4;
        if (sVar1 == 10) break;
        psVar4 = psVar4 + 0x28;
        bVar7 = uVar5 < (ulong)(long)iStack_23c;
        uVar5 = uVar5 + 1;
      } while (bVar7);
      uVar6 = (uint)(sVar1 == 10);
    }
    uv_free_interface_addresses();
  }
  return uVar6;
}

Assistant:

TEST_IMPL(tcp_bind6_error_addrinuse) {
  struct sockaddr_in6 addr;
  uv_tcp_t server1, server2;
  int r;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip6_addr("::", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server1);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server1, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_tcp_init(uv_default_loop(), &server2);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server2, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*)&server1, 128, NULL);
  ASSERT(r == 0);
  r = uv_listen((uv_stream_t*)&server2, 128, NULL);
  ASSERT(r == UV_EADDRINUSE);

  uv_close((uv_handle_t*)&server1, close_cb);
  uv_close((uv_handle_t*)&server2, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}